

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_postprocess.cpp
# Opt level: O3

void __thiscall FGLRenderer::CopyToBackbuffer(FGLRenderer *this,GL_IRECT *bounds,bool applyGamma)

{
  bool bVar1;
  GL_IRECT box;
  FGLPostProcessState savedState;
  GL_IRECT local_68;
  FGLPostProcessState local_50;
  
  F2DDrawer::Draw(this->m2DDrawer);
  F2DDrawer::Clear(this->m2DDrawer);
  FString::FString((FString *)&local_50,"CopyToBackbuffer");
  FGLDebug::PushGroup((FString *)&local_50);
  FString::~FString((FString *)&local_50);
  bVar1 = FGLRenderBuffers::IsEnabled();
  if (bVar1) {
    FGLPostProcessState::FGLPostProcessState(&local_50);
    FGLRenderBuffers::BindOutputFB(this->mBuffers);
    if (bounds == (GL_IRECT *)0x0) {
      ClearBorders(this);
      local_68.left = (this->mOutputLetterbox).left;
      local_68.top = (this->mOutputLetterbox).top;
      local_68.width = (this->mOutputLetterbox).width;
      local_68.height = (this->mOutputLetterbox).height;
    }
    else {
      local_68.left = bounds->left;
      local_68.top = bounds->top;
      local_68.width = bounds->width;
      local_68.height = bounds->height;
    }
    FGLRenderBuffers::BindCurrentTexture(this->mBuffers,0);
    DrawPresentTexture(this,&local_68,applyGamma);
  }
  else {
    if (bounds != (GL_IRECT *)0x0) goto LAB_0037f1b3;
    FGLPostProcessState::FGLPostProcessState(&local_50);
    ClearBorders(this);
  }
  FGLPostProcessState::~FGLPostProcessState(&local_50);
LAB_0037f1b3:
  FGLDebug::PopGroup();
  return;
}

Assistant:

void FGLRenderer::CopyToBackbuffer(const GL_IRECT *bounds, bool applyGamma)
{
	m2DDrawer->Draw();	// draw all pending 2D stuff before copying the buffer
	m2DDrawer->Clear();

	FGLDebug::PushGroup("CopyToBackbuffer");
	if (FGLRenderBuffers::IsEnabled())
	{
		FGLPostProcessState savedState;
		mBuffers->BindOutputFB();

		GL_IRECT box;
		if (bounds)
		{
			box = *bounds;
		}
		else
		{
			ClearBorders();
			box = mOutputLetterbox;
		}

		mBuffers->BindCurrentTexture(0);
		DrawPresentTexture(box, applyGamma);
	}
	else if (!bounds)
	{
		FGLPostProcessState savedState;
		ClearBorders();
	}
	FGLDebug::PopGroup();
}